

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::InvokeDefaultDelegate(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *dest)

{
  int iVar1;
  SQObjectPtr *in_RCX;
  SQObjectPtr *in_RDX;
  SQTable *in_RSI;
  SQTable *ddel;
  bool local_1;
  
  iVar1 = *(int *)&(in_RSI->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                   _vptr_SQRefCounted;
  if (((((iVar1 == 0x1000008) || (iVar1 == 0x5000002)) || (iVar1 == 0x5000004)) ||
      (((iVar1 == 0x8000010 || (iVar1 == 0x8000040)) ||
       ((iVar1 == 0x8000100 || ((iVar1 == 0x8000200 || (iVar1 == 0x8000400)))))))) ||
     ((iVar1 == 0x8001000 ||
      ((((iVar1 == 0x8004000 || (iVar1 == 0x8010000)) || (iVar1 == 0xa000020)) ||
       (iVar1 == 0xa008000)))))) {
    local_1 = SQTable::Get(in_RSI,in_RDX,in_RCX);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SQVM::InvokeDefaultDelegate(const SQObjectPtr &self,const SQObjectPtr &key,SQObjectPtr &dest)
{
    SQTable *ddel = NULL;
    switch(type(self)) {
        case OT_CLASS: ddel = _class_ddel; break;
        case OT_TABLE: ddel = _table_ddel; break;
        case OT_ARRAY: ddel = _array_ddel; break;
        case OT_STRING: ddel = _string_ddel; break;
        case OT_INSTANCE: ddel = _instance_ddel; break;
        case OT_INTEGER:case OT_FLOAT:case OT_BOOL: ddel = _number_ddel; break;
        case OT_GENERATOR: ddel = _generator_ddel; break;
        case OT_CLOSURE: case OT_NATIVECLOSURE: ddel = _closure_ddel; break;
        case OT_THREAD: ddel = _thread_ddel; break;
        case OT_WEAKREF: ddel = _weakref_ddel; break;
        default: return false;
    }
    return  ddel->Get(key,dest);
}